

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_amend.c
# Opt level: O0

LY_ERR lys_compile_node_deviations_refines
                 (lysc_ctx *ctx,lysp_node *pnode,lysc_node *parent,lysp_node **dev_pnode,
                 ly_bool *not_supported)

{
  lyd_node *plVar1;
  ly_bool lVar2;
  lysc_refine *local_70;
  lysc_refine *local_60;
  lysc_deviation *dev;
  lysc_refine *rfn;
  uint64_t u;
  uint32_t i;
  LY_ERR ret;
  ly_bool *not_supported_local;
  lysp_node **dev_pnode_local;
  lysc_node *parent_local;
  lysp_node *pnode_local;
  lysc_ctx *ctx_local;
  
  u._4_4_ = LY_SUCCESS;
  *dev_pnode = (lysp_node *)0x0;
  *not_supported = '\0';
  u._0_4_ = 0;
  while ((uint)u < (ctx->uses_rfns).count) {
    plVar1 = (ctx->uses_rfns).field_2.dnodes[(uint)u];
    lVar2 = lysp_schema_nodeid_match
                      (*(lysc_nodeid **)plVar1,(lysp_module *)plVar1->schema,
                       (lysp_ext_instance *)0x0,(lysc_node *)plVar1->parent,parent,pnode,
                       ctx->cur_mod,ctx->ext);
    if (lVar2 == '\0') {
      u._0_4_ = (uint)u + 1;
    }
    else {
      if ((*dev_pnode == (lysp_node *)0x0) &&
         (u._4_4_ = lysp_dup_single(ctx,pnode,'\x01',dev_pnode), u._4_4_ != LY_SUCCESS))
      goto LAB_0017b44b;
      rfn = (lysc_refine *)0x0;
      while( true ) {
        if (plVar1->prev == (lyd_node *)0x0) {
          local_60 = (lysc_refine *)0x0;
        }
        else {
          local_60 = (lysc_refine *)plVar1->prev[-1].priv;
        }
        if (local_60 <= rfn) break;
        u._4_4_ = lys_apply_refine(ctx,*(lysp_refine **)(&plVar1->prev->hash + (long)rfn * 2),
                                   (lysp_module *)plVar1->schema,*dev_pnode);
        if (u._4_4_ != LY_SUCCESS) goto LAB_0017b44b;
        rfn = (lysc_refine *)((long)&rfn->nodeid + 1);
      }
      lysc_refine_free(ctx->ctx,(lysc_refine *)plVar1);
      ly_set_rm_index(&ctx->uses_rfns,(uint)u,(_func_void_void_ptr *)0x0);
    }
  }
  for (u._0_4_ = 0; (uint)u < (ctx->devs).count; u._0_4_ = (uint)u + 1) {
    plVar1 = (ctx->devs).field_2.dnodes[(uint)u];
    lVar2 = lysp_schema_nodeid_match
                      (*(lysc_nodeid **)plVar1,*(lysp_module **)&plVar1->parent->field_0,
                       (lysp_ext_instance *)0x0,(lysc_node *)0x0,parent,pnode,ctx->cur_mod,ctx->ext)
    ;
    if (lVar2 != '\0') {
      if (*(ly_bool *)&plVar1->next != '\0') {
        *not_supported = '\x01';
        goto LAB_0017b415;
      }
      if ((*dev_pnode != (lysp_node *)0x0) ||
         (u._4_4_ = lysp_dup_single(ctx,pnode,'\x01',dev_pnode), u._4_4_ == LY_SUCCESS)) {
        rfn = (lysc_refine *)0x0;
        goto LAB_0017b38c;
      }
      break;
    }
  }
LAB_0017b44b:
  if (u._4_4_ != LY_SUCCESS) {
    lysp_dev_node_free(ctx,*dev_pnode);
    *dev_pnode = (lysp_node *)0x0;
    *not_supported = '\0';
  }
  return u._4_4_;
LAB_0017b38c:
  if (plVar1->schema == (lysc_node *)0x0) {
    local_70 = (lysc_refine *)0x0;
  }
  else {
    local_70 = (lysc_refine *)plVar1->schema[-1].priv;
  }
  if (local_70 <= rfn) goto LAB_0017b415;
  u._4_4_ = lys_apply_deviation(ctx,*(lysp_deviation **)(plVar1->schema->hash + (long)rfn * 8 + -4),
                                *(lysp_module **)((long)&plVar1->parent->field_0 + (long)rfn * 8),
                                *dev_pnode);
  if (u._4_4_ != LY_SUCCESS) goto LAB_0017b44b;
  rfn = (lysc_refine *)((long)&rfn->nodeid + 1);
  goto LAB_0017b38c;
LAB_0017b415:
  lysc_deviation_free(ctx->ctx,(lysc_deviation *)plVar1);
  ly_set_rm_index(&ctx->devs,(uint)u,(_func_void_void_ptr *)0x0);
  goto LAB_0017b44b;
}

Assistant:

LY_ERR
lys_compile_node_deviations_refines(struct lysc_ctx *ctx, const struct lysp_node *pnode, const struct lysc_node *parent,
        struct lysp_node **dev_pnode, ly_bool *not_supported)
{
    LY_ERR ret = LY_SUCCESS;
    uint32_t i;
    LY_ARRAY_COUNT_TYPE u;
    struct lysc_refine *rfn;
    struct lysc_deviation *dev;

    *dev_pnode = NULL;
    *not_supported = 0;

    for (i = 0; i < ctx->uses_rfns.count; ) {
        rfn = ctx->uses_rfns.objs[i];

        if (!lysp_schema_nodeid_match(rfn->nodeid, rfn->nodeid_pmod, NULL, rfn->nodeid_ctx_node, parent, pnode,
                ctx->cur_mod, ctx->ext)) {
            /* not our target node */
            ++i;
            continue;
        }

        if (!*dev_pnode) {
            /* first refine on this node, create a copy first */
            LY_CHECK_GOTO(ret = lysp_dup_single(ctx, pnode, 1, dev_pnode), cleanup);
        }

        /* apply all the refines by changing (the copy of) the parsed node */
        LY_ARRAY_FOR(rfn->rfns, u) {
            LY_CHECK_GOTO(ret = lys_apply_refine(ctx, rfn->rfns[u], rfn->nodeid_pmod, *dev_pnode), cleanup);
        }

        /* refine was applied, remove it */
        lysc_refine_free(ctx->ctx, rfn);
        ly_set_rm_index(&ctx->uses_rfns, i, NULL);

        /* refines use relative paths so more may apply to a single node */
    }

    for (i = 0; i < ctx->devs.count; ++i) {
        dev = ctx->devs.objs[i];

        if (!lysp_schema_nodeid_match(dev->nodeid, dev->dev_pmods[0], NULL, NULL, parent, pnode, ctx->cur_mod, ctx->ext)) {
            /* not our target node */
            continue;
        }

        if (dev->not_supported) {
            /* it is not supported, no more deviations */
            *not_supported = 1;
            goto dev_applied;
        }

        if (!*dev_pnode) {
            /* first deviation on this node, create a copy first */
            LY_CHECK_GOTO(ret = lysp_dup_single(ctx, pnode, 1, dev_pnode), cleanup);
        }

        /* apply all the deviates by changing (the copy of) the parsed node */
        LY_ARRAY_FOR(dev->devs, u) {
            LY_CHECK_GOTO(ret = lys_apply_deviation(ctx, dev->devs[u], dev->dev_pmods[u], *dev_pnode), cleanup);
        }

dev_applied:
        /* deviation was applied, remove it */
        lysc_deviation_free(ctx->ctx, dev);
        ly_set_rm_index(&ctx->devs, i, NULL);

        /* all the deviations for one target node are in one structure, we are done */
        break;
    }

cleanup:
    if (ret) {
        lysp_dev_node_free(ctx, *dev_pnode);
        *dev_pnode = NULL;
        *not_supported = 0;
    }
    return ret;
}